

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForbiddenPointFinder.cpp
# Opt level: O0

bool __thiscall
ForbiddenPointFinder::isFour(ForbiddenPointFinder *this,int x,int y,int nColor,int nDir)

{
  bool bVar1;
  int local_34;
  int local_30;
  int j;
  int i;
  Stone c;
  int nDir_local;
  int nColor_local;
  int y_local;
  int x_local;
  ForbiddenPointFinder *this_local;
  
  if (((this->cBoard[x + 1][y + 1] == Empty) && (bVar1 = isFive(this,x,y,nColor), !bVar1)) &&
     ((nColor != 0 || (bVar1 = isOverline(this,x,y), !bVar1)))) {
    if (nColor == 0) {
      j = 0x58;
    }
    else {
      if (nColor != 1) {
        return false;
      }
      j = 0x4f;
    }
    setStone(this,x,y,j);
    local_30 = x;
    switch(nDir) {
    case 1:
      for (; 0 < local_30; local_30 = local_30 + -1) {
        if (this->cBoard[local_30][y + 1] != j) {
          if ((this->cBoard[local_30][y + 1] == Empty) &&
             (bVar1 = isFive(this,local_30 + -1,y,0,nDir), bVar1)) {
            setStone(this,x,y,Empty);
            return true;
          }
          break;
        }
      }
      for (local_30 = x + 2; local_30 < 0x10; local_30 = local_30 + 1) {
        if (this->cBoard[local_30][y + 1] != j) {
          if ((this->cBoard[local_30][y + 1] == Empty) &&
             (bVar1 = isFive(this,local_30 + -1,y,0,nDir), bVar1)) {
            setStone(this,x,y,Empty);
            return true;
          }
          break;
        }
      }
      setStone(this,x,y,Empty);
      break;
    case 2:
      for (local_30 = y; 0 < local_30; local_30 = local_30 + -1) {
        if (this->cBoard[x + 1][local_30] != j) {
          if ((this->cBoard[x + 1][local_30] == Empty) &&
             (bVar1 = isFive(this,x,local_30 + -1,0,nDir), bVar1)) {
            setStone(this,x,y,Empty);
            return true;
          }
          break;
        }
      }
      for (local_30 = y + 2; local_30 < 0x10; local_30 = local_30 + 1) {
        if (this->cBoard[x + 1][local_30] != j) {
          if ((this->cBoard[x + 1][local_30] == Empty) &&
             (bVar1 = isFive(this,x,local_30 + -1,0,nDir), bVar1)) {
            setStone(this,x,y,Empty);
            return true;
          }
          break;
        }
      }
      setStone(this,x,y,Empty);
      break;
    case 3:
      local_34 = y;
      for (; 0 < local_30 && 0 < local_34; local_30 = local_30 + -1) {
        if (this->cBoard[local_30][local_34] != j) {
          if ((this->cBoard[local_30][local_34] == Empty) &&
             (bVar1 = isFive(this,local_30 + -1,local_34 + -1,0,nDir), bVar1)) {
            setStone(this,x,y,Empty);
            return true;
          }
          break;
        }
        local_34 = local_34 + -1;
      }
      local_34 = y + 2;
      for (local_30 = x + 2; local_30 < 0x10 && local_34 < 0x10; local_30 = local_30 + 1) {
        if (this->cBoard[local_30][local_34] != j) {
          if ((this->cBoard[local_30][local_34] == Empty) &&
             (bVar1 = isFive(this,local_30 + -1,local_34 + -1,0,nDir), bVar1)) {
            setStone(this,x,y,Empty);
            return true;
          }
          break;
        }
        local_34 = local_34 + 1;
      }
      setStone(this,x,y,Empty);
      break;
    case 4:
      local_34 = y + 2;
      for (; 0 < local_30 && local_34 < 0x10; local_30 = local_30 + -1) {
        if (this->cBoard[local_30][local_34] != j) {
          if ((this->cBoard[local_30][local_34] == Empty) &&
             (bVar1 = isFive(this,local_30 + -1,local_34 + -1,0,nDir), bVar1)) {
            setStone(this,x,y,Empty);
            return true;
          }
          break;
        }
        local_34 = local_34 + 1;
      }
      local_34 = y;
      for (local_30 = x + 2; local_30 < 0x10 && 0 < local_34; local_30 = local_30 + 1) {
        if (this->cBoard[local_30][local_34] != j) {
          if ((this->cBoard[local_30][local_34] == Empty) &&
             (bVar1 = isFive(this,local_30 + -1,local_34 + -1,0,nDir), bVar1)) {
            setStone(this,x,y,Empty);
            return true;
          }
          break;
        }
        local_34 = local_34 + -1;
      }
      setStone(this,x,y,Empty);
      break;
    default:
      setStone(this,x,y,Empty);
    }
  }
  return false;
}

Assistant:

bool ForbiddenPointFinder::isFour(int x, int y, int nColor, int nDir) {
    if (cBoard[x + 1][y + 1] != Stone::Empty)
        return false;

    if (isFive(x, y, nColor))    // five?
        return false;
    else if ((nColor == 0) && (isOverline(x, y)))    // black overline?
        return false;
    else {
        Stone c;
        if (nColor == 0)    // black
            c = Stone::Black;
        else if (nColor == 1)    // white
            c = Stone::White;
        else
            return false;

        setStone(x, y, c);

        int i, j;

        switch (nDir) {
            case 1:        // horizontal direction
                i = x;
                while (i > 0) {
                    if (cBoard[i][y + 1] == c) {
                        i--;
                        continue;
                    } else if (cBoard[i][y + 1] == Stone::Empty) {
                        if (isFive(i - 1, y, 0, nDir)) {
                            setStone(x, y, Stone::Empty);
                            return true;
                        } else
                            break;
                    } else
                        break;
                }
                i = x + 2;
                while (i < (BoardSize + 1)) {
                    if (cBoard[i][y + 1] == c) {
                        i++;
                        continue;
                    } else if (cBoard[i][y + 1] == Stone::Empty) {
                        if (isFive(i - 1, y, 0, nDir)) {
                            setStone(x, y, Stone::Empty);
                            return true;
                        } else
                            break;
                    } else
                        break;
                }
                setStone(x, y, Stone::Empty);
                return false;
                break;
            case 2:        // vertial direction
                i = y;
                while (i > 0) {
                    if (cBoard[x + 1][i] == c) {
                        i--;
                        continue;
                    } else if (cBoard[x + 1][i] == Stone::Empty) {
                        if (isFive(x, i - 1, 0, nDir)) {
                            setStone(x, y, Stone::Empty);
                            return true;
                        } else
                            break;
                    } else
                        break;
                }
                i = y + 2;
                while (i < (BoardSize + 1)) {
                    if (cBoard[x + 1][i] == c) {
                        i++;
                        continue;
                    } else if (cBoard[x + 1][i] == Stone::Empty) {
                        if (isFive(x, i - 1, 0, nDir)) {
                            setStone(x, y, Stone::Empty);
                            return true;
                        } else
                            break;
                    } else
                        break;
                }
                setStone(x, y, Stone::Empty);
                return false;
                break;
            case 3:        // diagonal direction - '/'
                i = x;
                j = y;
                while ((i > 0) && (j > 0)) {
                    if (cBoard[i][j] == c) {
                        i--;
                        j--;
                        continue;
                    } else if (cBoard[i][j] == Stone::Empty) {
                        if (isFive(i - 1, j - 1, 0, nDir)) {
                            setStone(x, y, Stone::Empty);
                            return true;
                        } else
                            break;
                    } else
                        break;
                }
                i = x + 2;
                j = y + 2;
                while ((i < (BoardSize + 1)) && (j < (BoardSize + 1))) {
                    if (cBoard[i][j] == c) {
                        i++;
                        j++;
                        continue;
                    } else if (cBoard[i][j] == Stone::Empty) {
                        if (isFive(i - 1, j - 1, 0, nDir)) {
                            setStone(x, y, Stone::Empty);
                            return true;
                        } else
                            break;
                    } else
                        break;
                }
                setStone(x, y, Stone::Empty);
                return false;
                break;
            case 4:        // diagonal direction - '\'
                i = x;
                j = y + 2;
                while ((i > 0) && (j < (BoardSize + 1))) {
                    if (cBoard[i][j] == c) {
                        i--;
                        j++;
                        continue;
                    } else if (cBoard[i][j] == Stone::Empty) {
                        if (isFive(i - 1, j - 1, 0, nDir)) {
                            setStone(x, y, Stone::Empty);
                            return true;
                        } else
                            break;
                    } else
                        break;
                }
                i = x + 2;
                j = y;
                while ((i < (BoardSize + 1)) && (j > 0)) {
                    if (cBoard[i][j] == c) {
                        i++;
                        j--;
                        continue;
                    } else if (cBoard[i][j] == Stone::Empty) {
                        if (isFive(i - 1, j - 1, 0, nDir)) {
                            setStone(x, y, Stone::Empty);
                            return true;
                        } else
                            break;
                    } else
                        break;
                }
                setStone(x, y, Stone::Empty);
                return false;
                break;
            default:
                setStone(x, y, Stone::Empty);
                return false;
                break;
        }
    }
}